

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O2

void __thiscall hand::sortHand(hand *this)

{
  pointer pcVar1;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  *puVar2;
  card *i;
  pointer __x;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  regHand;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  specialHand;
  
  regHand._M_t.
  super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>,_true,_true>
        )operator_new(0x18);
  *(undefined8 *)
   regHand._M_t.
   super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
   .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)regHand._M_t.
          super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl + 8
   ) = 0;
  *(undefined8 *)
   ((long)regHand._M_t.
          super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl +
   0x10) = 0;
  specialHand._M_t.
  super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>,_true,_true>
        )operator_new(0x18);
  *(undefined8 *)
   ((long)specialHand._M_t.
          super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl +
   0x10) = 0;
  *(undefined8 *)
   specialHand._M_t.
   super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
   .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)specialHand._M_t.
          super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
          .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl + 8
   ) = 0;
  pcVar1 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__x = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pcVar1; __x = __x + 1) {
    puVar2 = &specialHand;
    if (__x->cardType == 0) {
      puVar2 = &regHand;
    }
    std::vector<card,_std::allocator<card>_>::push_back
              ((puVar2->_M_t).
               super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
               .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>.
               _M_head_impl,__x);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
            (*(card **)regHand._M_t.
                       super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                       .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>.
                       _M_head_impl,
             *(card **)((long)regHand._M_t.
                              super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              .
                              super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>
                              ._M_head_impl + 8),
             (_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x102728);
  std::
  __sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
            (*(card **)specialHand._M_t.
                       super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                       .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>.
                       _M_head_impl,
             *(card **)((long)specialHand._M_t.
                              super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              .
                              super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>
                              ._M_head_impl + 8),
             (_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x102732);
  std::vector<card,std::allocator<card>>::
  insert<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,void>
            ((vector<card,std::allocator<card>> *)
             regHand._M_t.
             super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
             .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl,
             *(card **)((long)regHand._M_t.
                              super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              .
                              super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>
                              ._M_head_impl + 8),
             *(card **)specialHand._M_t.
                       super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                       .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>.
                       _M_head_impl,
             *(card **)((long)specialHand._M_t.
                              super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
                              .
                              super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>
                              ._M_head_impl + 8));
  std::_Vector_base<card,_std::allocator<card>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->hand_,
             (_Vector_impl_data *)
             regHand._M_t.
             super___uniq_ptr_impl<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<card,_std::allocator<card>_>_*,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
             .super__Head_base<0UL,_std::vector<card,_std::allocator<card>_>_*,_false>._M_head_impl)
  ;
  std::
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  ::~unique_ptr(&specialHand);
  std::
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  ::~unique_ptr(&regHand);
  return;
}

Assistant:

void hand::sortHand() {
    unique_ptr <vector<card>> regHand(new vector<card>);
    unique_ptr <vector<card>> specialHand(new vector<card>);
    for (auto &i : hand_) {
        if(isRegularCard(i))regHand->push_back(i);
        else specialHand->push_back(i);
    }
    sort(regHand->begin(),regHand->end(),sortByValue);
    sort(specialHand->begin(),specialHand->end(),sortByName);
    regHand->insert(regHand->end(),specialHand->begin(),specialHand->end());
    hand_.swap(*regHand);
}